

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet.cpp
# Opt level: O3

ssize_t __thiscall Packet::read(Packet *this,int __fd,void *__buf,size_t __nbytes)

{
  uint *puVar1;
  pointer pcVar2;
  ulong in_RAX;
  size_t sVar3;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  ulong extraout_RAX_01;
  undefined4 in_register_00000034;
  basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  *this_00;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  vector<char,_std::allocator<char>_> extras;
  vector<char,_std::allocator<char>_> local_58;
  mutable_buffers_1 local_40;
  
  this_00 = (basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
             *)CONCAT44(in_register_00000034,__fd);
  if (0 < (long)this->ext_len) {
    std::vector<char,_std::allocator<char>_>::vector
              (&local_58,(long)this->ext_len,(allocator_type *)&local_40);
    if (this->ext_len != 0) {
      uVar4 = 0;
      do {
        local_40.super_mutable_buffer.size_ =
             (long)local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start;
        local_40.super_mutable_buffer.data_ = (uint *)0x0;
        if (local_40.super_mutable_buffer.size_ != 0) {
          local_40.super_mutable_buffer.data_ =
               local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start;
        }
        sVar3 = boost::asio::
                basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                ::receive<boost::asio::mutable_buffers_1>(this_00,&local_40);
        uVar4 = uVar4 + (int)sVar3;
      } while (uVar4 < (uint)this->ext_len);
    }
    in_RAX = (long)local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start;
    if (in_RAX < 5) {
      if ((uint *)local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start == (uint *)0x0) goto LAB_00120b14;
    }
    else {
      uVar4 = *(uint *)local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start;
      this->flags = uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
    }
    operator_delete(local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start);
    in_RAX = extraout_RAX;
  }
LAB_00120b14:
  uVar4 = 0;
  if ((ulong)this->key_len != 0) {
    std::vector<char,_std::allocator<char>_>::resize(&this->key,(ulong)this->key_len);
    in_RAX = extraout_RAX_00;
    uVar4 = 0;
    if (this->key_len != 0) {
      uVar6 = 0;
      do {
        puVar1 = (uint *)(this->key).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start;
        local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_finish = (this->key).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_finish + -(long)puVar1;
        local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)(uint *)0x0;
        if (local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
            ._M_finish != (pointer)0x0) {
          local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)puVar1;
        }
        in_RAX = boost::asio::
                 basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                 ::receive<boost::asio::mutable_buffers_1>(this_00,(mutable_buffers_1 *)&local_58);
        uVar6 = uVar6 + (int)in_RAX;
        uVar4 = (uint)this->key_len;
      } while (uVar6 < this->key_len);
    }
  }
  uVar6 = this->bod_len;
  if (uVar4 < uVar6) {
    uVar4 = uVar4 + this->ext_len;
    std::vector<char,_std::allocator<char>_>::resize(&this->val,(ulong)(uVar6 - uVar4));
    in_RAX = extraout_RAX_01;
    if (uVar6 != uVar4) {
      uVar5 = 0;
      do {
        pcVar2 = (this->val).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_finish = (this->val).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_finish + -(long)pcVar2;
        local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        if (local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
            ._M_finish != (pointer)0x0) {
          local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start = pcVar2;
        }
        in_RAX = boost::asio::
                 basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                 ::receive<boost::asio::mutable_buffers_1>(this_00,(mutable_buffers_1 *)&local_58);
        uVar5 = uVar5 + (int)in_RAX;
      } while (uVar5 < uVar6 - uVar4);
    }
  }
  return in_RAX;
}

Assistant:

void Packet::read(socket& socket) {
  std::uint32_t bytes_read = 0;

  if (ext_len > 0) {
    std::vector<char> extras(ext_len);
    while (bytes_read < static_cast<std::uint32_t>(ext_len)) {
      bytes_read += socket.receive(boost::asio::buffer(extras));
    }
    bytes_read = 0;

    if (extras.size() > 4) {
      char flags_buf[4] = { extras[0], extras[1], extras[2], extras[3] };
      flags = readUInt32LE(flags_buf, 0);
    }
  }

  if (key_len > 0) {
    key.resize(key_len);
    while (bytes_read < key_len) {
      bytes_read += socket.receive(boost::asio::buffer(key));
    }
    bytes_read = 0;
  }

  if (bod_len > key_len) {
    std::uint32_t val_len = bod_len - key_len - ext_len;
    val.resize(val_len);
    while (bytes_read < val_len) {
      bytes_read += socket.receive(boost::asio::buffer(val));
    }
  }
}